

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::HlslParseContext::arraySizeCheck
          (HlslParseContext *this,TSourceLoc *loc,TIntermTyped *expr,TArraySize *sizePair)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  TConstUnionArray *pTVar5;
  TConstUnion *pTVar6;
  undefined4 extraout_var_00;
  TIntermSymbol *this_00;
  TIntermSymbol *symbol;
  TIntermConstantUnion *constant;
  bool isConst;
  TArraySize *sizePair_local;
  TIntermTyped *expr_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  undefined4 extraout_var_01;
  
  bVar1 = false;
  sizePair->size = 1;
  sizePair->node = (TIntermTyped *)0x0;
  iVar3 = (*(expr->super_TIntermNode)._vptr_TIntermNode[5])();
  if ((TIntermConstantUnion *)CONCAT44(extraout_var,iVar3) == (TIntermConstantUnion *)0x0) {
    iVar3 = (*(expr->super_TIntermNode)._vptr_TIntermNode[0x21])();
    bVar2 = TQualifier::isSpecConstant((TQualifier *)CONCAT44(extraout_var_00,iVar3));
    if (bVar2) {
      bVar1 = true;
      sizePair->node = expr;
      iVar3 = (*(expr->super_TIntermNode)._vptr_TIntermNode[0xc])();
      this_00 = (TIntermSymbol *)CONCAT44(extraout_var_01,iVar3);
      if (this_00 != (TIntermSymbol *)0x0) {
        pTVar5 = TIntermSymbol::getConstArray(this_00);
        iVar3 = TConstUnionArray::size(pTVar5);
        if (0 < iVar3) {
          pTVar5 = TIntermSymbol::getConstArray(this_00);
          pTVar6 = TConstUnionArray::operator[](pTVar5,0);
          uVar4 = TConstUnion::getIConst(pTVar6);
          sizePair->size = uVar4;
        }
      }
    }
  }
  else {
    pTVar5 = TIntermConstantUnion::getConstArray
                       ((TIntermConstantUnion *)CONCAT44(extraout_var,iVar3));
    pTVar6 = TConstUnionArray::operator[](pTVar5,0);
    uVar4 = TConstUnion::getIConst(pTVar6);
    sizePair->size = uVar4;
    bVar1 = true;
  }
  if ((bVar1) &&
     ((iVar3 = (*(expr->super_TIntermNode)._vptr_TIntermNode[0x20])(), iVar3 == 8 ||
      (iVar3 = (*(expr->super_TIntermNode)._vptr_TIntermNode[0x20])(), iVar3 == 9)))) {
    if (sizePair->size == 0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"array size must be a positive integer","");
    }
  }
  else {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"array size must be a constant integer expression","");
  }
  return;
}

Assistant:

void HlslParseContext::arraySizeCheck(const TSourceLoc& loc, TIntermTyped* expr, TArraySize& sizePair)
{
    bool isConst = false;
    sizePair.size = 1;
    sizePair.node = nullptr;

    TIntermConstantUnion* constant = expr->getAsConstantUnion();
    if (constant) {
        // handle true (non-specialization) constant
        sizePair.size = constant->getConstArray()[0].getIConst();
        isConst = true;
    } else {
        // see if it's a specialization constant instead
        if (expr->getQualifier().isSpecConstant()) {
            isConst = true;
            sizePair.node = expr;
            TIntermSymbol* symbol = expr->getAsSymbolNode();
            if (symbol && symbol->getConstArray().size() > 0)
                sizePair.size = symbol->getConstArray()[0].getIConst();
        }
    }

    if (! isConst || (expr->getBasicType() != EbtInt && expr->getBasicType() != EbtUint)) {
        error(loc, "array size must be a constant integer expression", "", "");
        return;
    }

    if (sizePair.size <= 0) {
        error(loc, "array size must be a positive integer", "", "");
        return;
    }
}